

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# access.c
# Opt level: O2

void CheckColorAvailable(TidyDocImpl *doc,Node *node)

{
  TidyTagId TVar1;
  
  if ((0xfffffffc < (doc->access).PRIORITYCHK - 4U) && (node->tag != (Dict *)0x0)) {
    TVar1 = node->tag->id;
    if (TVar1 == TidyTag_SCRIPT) {
      prvTidyReportAccessError(doc,node,0x2b0);
      return;
    }
    if (TVar1 == TidyTag_IMG) {
      prvTidyReportAccessError(doc,node,0x2ad);
      return;
    }
    if (TVar1 == TidyTag_INPUT) {
      prvTidyReportAccessError(doc,node,0x2b1);
      return;
    }
    if (TVar1 == TidyTag_OBJECT) {
      prvTidyReportAccessError(doc,node,0x2af);
      return;
    }
    if (TVar1 == TidyTag_APPLET) {
      prvTidyReportAccessError(doc,node,0x2ae);
      return;
    }
  }
  return;
}

Assistant:

static void CheckColorAvailable( TidyDocImpl* doc, Node* node )
{
    if (Level1_Enabled( doc ))
    {
        if ( nodeIsIMG(node) )
            TY_(ReportAccessError)( doc, node, INFORMATION_NOT_CONVEYED_IMAGE );

        else if ( nodeIsAPPLET(node) )
            TY_(ReportAccessError)( doc, node, INFORMATION_NOT_CONVEYED_APPLET );

        else if ( nodeIsOBJECT(node) )
            TY_(ReportAccessError)( doc, node, INFORMATION_NOT_CONVEYED_OBJECT );

        else if ( nodeIsSCRIPT(node) )
            TY_(ReportAccessError)( doc, node, INFORMATION_NOT_CONVEYED_SCRIPT );

        else if ( nodeIsINPUT(node) )
            TY_(ReportAccessError)( doc, node, INFORMATION_NOT_CONVEYED_INPUT );
    }
}